

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O1

bool __thiscall QtPrivate::equalStrings(QtPrivate *this,QStringView lhs,QLatin1StringView rhs)

{
  QtPrivate *pQVar1;
  byte bVar2;
  ushort uVar3;
  byte *pbVar4;
  int iVar5;
  
  pbVar4 = (byte *)lhs.m_size;
  pQVar1 = this + (long)lhs.m_data * 2;
  do {
    if (pQVar1 <= this) {
      iVar5 = 0;
      break;
    }
    uVar3 = *(ushort *)this;
    bVar2 = *pbVar4;
    this = this + 2;
    pbVar4 = pbVar4 + 1;
    iVar5 = (uint)uVar3 - (uint)bVar2;
  } while (iVar5 == 0);
  return iVar5 == 0;
}

Assistant:

static int ucstrncmp(const char16_t *a, const char *b, size_t l)
{
    const uchar *c = reinterpret_cast<const uchar *>(b);
    const char16_t *uc = a;
    const char16_t *e = uc + l;

#if defined(__SSE2__) && !defined(__OPTIMIZE_SIZE__)
    return ucstrncmp_sse2<Mode>(uc, c, l);
#endif

    while (uc < e) {
        int diff = *uc - *c;
        if (diff)
            return diff;
        uc++, c++;
    }

    return 0;
}